

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

void update_meta(websocket *ws,int frame_age,int frame_flags,curl_off_t payload_offset,
                curl_off_t payload_len,size_t cur_len)

{
  curl_off_t bytesleft;
  size_t cur_len_local;
  curl_off_t payload_len_local;
  curl_off_t payload_offset_local;
  int frame_flags_local;
  int frame_age_local;
  websocket *ws_local;
  
  (ws->frame).age = frame_age;
  (ws->frame).flags = frame_flags;
  (ws->frame).offset = payload_offset;
  (ws->frame).len = cur_len;
  (ws->frame).bytesleft = (payload_len - payload_offset) - cur_len;
  return;
}

Assistant:

static void update_meta(struct websocket *ws,
                        int frame_age, int frame_flags,
                        curl_off_t payload_offset,
                        curl_off_t payload_len,
                        size_t cur_len)
{
  curl_off_t bytesleft = (payload_len - payload_offset - cur_len);

  ws->frame.age = frame_age;
  ws->frame.flags = frame_flags;
  ws->frame.offset = payload_offset;
  ws->frame.len = cur_len;
  ws->frame.bytesleft = bytesleft;
}